

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

SHADER_TYPE __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetActiveShaderStageType
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,Uint32 StageIndex)

{
  SHADER_TYPE SVar1;
  char (*Args_1) [40];
  uint uVar2;
  bool bVar3;
  string msg;
  string local_38;
  
  SVar1 = this->m_ShaderStages;
  Args_1 = (char (*) [40])(ulong)SVar1;
  uVar2 = SVar1 - (SVar1 >> 1 & 0x55555555);
  uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
  if (((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18 <= StageIndex) {
    FormatString<char[26],char[40]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"StageIndex < GetNumActiveShaderStages()",Args_1);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetActiveShaderStageType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x297);
    std::__cxx11::string::~string((string *)&local_38);
    Args_1 = (char (*) [40])(ulong)this->m_ShaderStages;
  }
  while( true ) {
    SVar1 = (SHADER_TYPE)Args_1;
    if (SVar1 == SHADER_TYPE_UNKNOWN) {
      FormatString<char[22]>(&local_38,(char (*) [22])"Index is out of range");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"GetActiveShaderStageType",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x2a2);
      std::__cxx11::string::~string((string *)&local_38);
      return SHADER_TYPE_UNKNOWN;
    }
    bVar3 = StageIndex == 0;
    StageIndex = StageIndex - 1;
    if (bVar3) break;
    Args_1 = (char (*) [40])(ulong)(SVar1 ^ -SVar1 & SVar1);
  }
  return -SVar1 & SVar1;
}

Assistant:

SHADER_TYPE GetActiveShaderStageType(Uint32 StageIndex) const
    {
        VERIFY_EXPR(StageIndex < GetNumActiveShaderStages());

        SHADER_TYPE Stages = m_ShaderStages;
        for (Uint32 Index = 0; Stages != SHADER_TYPE_UNKNOWN; ++Index)
        {
            SHADER_TYPE StageBit = ExtractLSB(Stages);

            if (Index == StageIndex)
                return StageBit;
        }

        UNEXPECTED("Index is out of range");
        return SHADER_TYPE_UNKNOWN;
    }